

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution3D::forward(Convolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  Mat *pMVar6;
  int iVar7;
  pointer piVar8;
  uint uVar9;
  uint _w;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  allocator_type local_1a9;
  Convolution3D *local_1a8;
  Option *local_1a0;
  long local_198;
  size_t local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  float *local_168;
  long local_160;
  void *local_158;
  size_t local_150;
  Mat *local_148;
  int local_13c;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  Mat local_118;
  void *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Option local_78;
  
  local_170 = (ulong)(uint)bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  iVar23 = this->kernel_w;
  iVar2 = this->kernel_h;
  iVar12 = this->dilation_w;
  iVar20 = this->dilation_h;
  iVar3 = this->kernel_d;
  iVar13 = this->dilation_d;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.blob_allocator = opt->blob_allocator;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar11._0_1_ = opt->use_bf16_storage;
  uVar11._1_1_ = opt->use_fp16_packed;
  uVar11._2_1_ = opt->use_fp16_storage;
  uVar11._3_1_ = opt->use_fp16_arithmetic;
  uVar11._4_1_ = opt->use_int8_packed;
  uVar11._5_1_ = opt->use_int8_storage;
  uVar11._6_1_ = opt->use_int8_arithmetic;
  uVar11._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_reserved_0 = opt->use_reserved_0;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_shader_local_memory = opt->use_shader_local_memory;
  local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
  local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
  local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
  local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
  local_78.use_reserved_6 = opt->use_reserved_6;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78._32_8_ = uVar11 & 0xffffffffffffff;
  local_1a0 = opt;
  make_padding(this,bottom_blob,&local_118,&local_78);
  iVar7 = local_118.h;
  iVar14 = -100;
  if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0)) {
    local_160 = CONCAT44(local_160._4_4_,local_118.w);
    uVar11 = (long)(~((iVar23 + -1) * iVar12) + local_118.w) / (long)this->stride_w;
    uVar10 = (long)(~((iVar2 + -1) * iVar20) + local_118.h) / (long)this->stride_h;
    uVar15 = (long)(~((iVar3 + -1) * iVar13) + local_118.d) / (long)this->stride_d;
    uVar9 = this->kernel_w * this->kernel_h * this->kernel_d;
    local_150 = sVar4;
    local_148 = top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&local_a0,(long)(int)uVar9,&local_1a9);
    piVar8 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pMVar6 = local_148;
    _w = (int)uVar11 + 1;
    local_158 = (void *)CONCAT44(local_158._4_4_,_w);
    iVar23 = this->kernel_d;
    if (0 < iVar23) {
      iVar2 = this->dilation_h;
      iVar12 = this->kernel_w;
      iVar16 = this->dilation_w * iVar12;
      iVar20 = this->kernel_h;
      iVar13 = iVar2 * iVar20;
      iVar3 = this->dilation_d;
      iVar14 = 0;
      iVar17 = 0;
      iVar18 = 0;
      do {
        if (0 < iVar20) {
          iVar23 = 0;
          do {
            if (0 < iVar12) {
              lVar21 = 0;
              do {
                local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar18 + lVar21] = iVar17;
                iVar17 = iVar17 + this->dilation_w;
                iVar12 = this->kernel_w;
                lVar21 = lVar21 + 1;
              } while ((int)lVar21 < iVar12);
              iVar18 = iVar18 + (int)lVar21;
              iVar20 = this->kernel_h;
            }
            iVar17 = iVar17 + (iVar2 * (int)local_160 - iVar16);
            iVar23 = iVar23 + 1;
          } while (iVar23 < iVar20);
          iVar23 = this->kernel_d;
        }
        iVar17 = iVar17 + (iVar7 * iVar3 - iVar13) * (int)local_160;
        iVar14 = iVar14 + 1;
      } while (iVar14 < iVar23);
    }
    local_1a8 = this;
    local_138 = uVar15 & 0xffffffff;
    local_130 = uVar10 & 0xffffffff;
    local_128 = uVar11 & 0xffffffff;
    Mat::create(local_148,_w,(int)uVar10 + 1,(int)uVar15 + 1,this->num_output,local_150,
                local_1a0->blob_allocator);
    local_d0 = pMVar6->data;
    iVar14 = -100;
    if ((local_d0 != (void *)0x0) && (local_190 = pMVar6->cstep, (long)pMVar6->c * local_190 != 0))
    {
      local_c8 = (long)this->num_output;
      if (0 < local_c8) {
        local_190 = local_190 * pMVar6->elemsize;
        local_b8 = (long)(int)_w;
        uVar22 = (ulong)_w;
        local_13c = (int)local_170 * uVar9;
        local_188 = 0;
        local_198 = 0;
        uVar11 = local_128;
        uVar10 = local_130;
        uVar15 = local_138;
        uVar19 = local_170;
        local_120 = uVar22;
        do {
          if (-1 < (int)uVar15) {
            local_c0 = (long)(int)local_188 << 2;
            local_1a0 = (Option *)(local_190 * local_198 + (long)local_d0);
            local_180 = 0;
            do {
              if (-1 < (int)uVar10) {
                local_148 = (Mat *)CONCAT44(local_148._4_4_,this->bias_term);
                local_b0 = (long)(this->weight_data).data + local_c0;
                local_178 = 0;
                local_150 = (size_t)(this->activation_type - 1);
                do {
                  if (-1 < (int)uVar11) {
                    local_168 = (float *)(local_1a8->activation_params).data;
                    local_158 = (local_1a8->bias_data).data;
                    lVar21 = (long)local_118.w *
                             CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
                    lVar24 = local_118.cstep *
                             CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
                    local_160 = (long)local_118.data +
                                (long)(int)local_178 * (long)local_1a8->stride_h * lVar21 +
                                local_118.h * lVar21 *
                                (long)(int)local_180 * (long)local_1a8->stride_d;
                    local_a8 = (long)local_1a8->stride_w;
                    uVar11 = 0;
                    do {
                      if ((int)local_148 == 0) {
                        fVar27 = 0.0;
                      }
                      else {
                        fVar27 = *(float *)((long)local_158 + local_198 * 4);
                      }
                      if (0 < (int)uVar19) {
                        uVar10 = 0;
                        lVar21 = local_b0;
                        do {
                          if (0 < (int)uVar9) {
                            uVar15 = 0;
                            do {
                              fVar27 = fVar27 + *(float *)(lVar21 + uVar15 * 4) *
                                                *(float *)(local_160 +
                                                          (long)piVar8[uVar15] * 4 +
                                                          lVar24 * uVar10 + uVar11 * local_a8 * 4);
                              uVar15 = uVar15 + 1;
                            } while (uVar9 != uVar15);
                          }
                          uVar10 = uVar10 + 1;
                          lVar21 = lVar21 + (long)(int)uVar9 * 4;
                        } while (uVar10 != uVar19);
                      }
                      fVar25 = fVar27;
                      if ((uint)local_150 < 6) {
                        switch((long)&switchD_004fe824::switchdataD_00523cc4 +
                               (long)(int)(&switchD_004fe824::switchdataD_00523cc4)[local_150]) {
                        case 0x4fe826:
                          if (fVar27 <= 0.0) {
                            fVar25 = 0.0;
                          }
                          break;
                        case 0x4fe836:
                          uStack_84 = 0;
                          uStack_80 = 0;
                          uStack_7c = 0;
                          local_88 = fVar27;
                          fVar27 = expf(fVar27);
                          fVar27 = logf(fVar27 + 1.0);
                          fVar27 = tanhf(fVar27);
                          uVar19 = local_170;
                          uVar22 = local_120;
                          fVar25 = fVar27 * local_88;
                          break;
                        case 0x4fe87a:
                          if (fVar27 <= *local_168) {
                            fVar27 = *local_168;
                          }
                          fVar25 = local_168[1];
                          if (fVar27 <= local_168[1]) {
                            fVar25 = fVar27;
                          }
                          break;
                        case 0x4fe899:
                          if (88.37626 <= fVar27) {
                            fVar27 = 88.37626;
                          }
                          fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                                               ~-(uint)(fVar27 < -88.37626) & (uint)-fVar27));
                          uVar19 = local_170;
                          uVar22 = local_120;
                          fVar25 = 1.0 / (fVar27 + 1.0);
                          break;
                        case 0x4fe8f5:
                          fVar25 = (float)(~-(uint)(0.0 < fVar27) & (uint)*local_168 |
                                          -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
                          break;
                        case 0x4fe920:
                          fVar1 = *local_168;
                          fVar26 = -local_168[1] / fVar1;
                          fVar25 = 0.0;
                          if ((fVar26 <= fVar27) &&
                             (fVar25 = fVar27, fVar27 <= fVar26 + 1.0 / fVar1)) {
                            fVar25 = (fVar1 * fVar27 + local_168[1]) * fVar27;
                          }
                        }
                      }
                      *(float *)(&local_1a0->lightmode + uVar11 * 4) = fVar25;
                      uVar11 = uVar11 + 1;
                    } while (uVar11 != uVar22);
                  }
                  local_1a0 = (Option *)(&local_1a0->lightmode + local_b8 * 4);
                  iVar23 = (int)local_178;
                  local_178 = (ulong)(iVar23 + 1);
                  uVar11 = local_128;
                  uVar10 = local_130;
                } while (iVar23 != (int)local_130);
              }
              iVar23 = (int)local_180;
              local_180 = (ulong)(iVar23 + 1);
              uVar15 = local_138;
              this = local_1a8;
            } while (iVar23 != (int)local_138);
          }
          local_198 = local_198 + 1;
          local_188 = (ulong)(uint)((int)local_188 + local_13c);
        } while (local_198 != local_c8);
      }
      iVar14 = 0;
    }
    if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int Convolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int z = 0; z < outd; z++)
        {
            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[p];

                    const float* kptr = (const float*)weight_data + maxk * channels * p;

                    for (int q = 0; q < channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];

                            float wt = kptr[l];
                            sum += val * wt;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }

    return 0;
}